

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxmtoau.c
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 *puVar1;
  uint8_t uVar2;
  int iVar3;
  size_t sVar4;
  undefined8 *in_RSI;
  int in_EDI;
  float buffer [4096];
  rusage r;
  anon_union_4_2_947300a4 u;
  size_t k;
  FILE *fp;
  size_t datalen;
  void *data;
  xm_context_t *ctx;
  undefined1 auStackY_40f8 [8];
  float *in_stack_ffffffffffffbf18;
  xm_context_t *in_stack_ffffffffffffbf20;
  rusage local_e0;
  undefined4 local_4c;
  ulong local_48;
  FILE *local_38;
  size_t local_30;
  char *local_28;
  xm_context_t *local_20;
  undefined1 *local_18;
  undefined8 *local_10;
  undefined4 local_4;
  
  local_18 = auStackY_40f8;
  local_4 = 0;
  puVar1 = auStackY_40f8;
  if (in_EDI == 2) {
    local_10 = in_RSI;
    local_38 = fopen((char *)in_RSI[1],"rb");
    if (local_38 == (FILE *)0x0) {
      __assert_fail("fp",
                    "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/libxmtoau.c"
                    ,0x2d,"int main(int, char **)");
    }
    sVar4 = fread(&local_30,8,1,local_38);
    if (sVar4 == 0) {
      __assert_fail("fread(&datalen, sizeof(size_t), 1, fp)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/libxmtoau.c"
                    ,0x2e,"int main(int, char **)");
    }
    rewind(local_38);
    sVar4 = local_30;
    iVar3 = fileno(local_38);
    local_28 = (char *)mmap((void *)0x0,sVar4,3,2,iVar3,0);
    if (local_28 == (char *)0xffffffffffffffff) {
      __assert_fail("data != MAP_FAILED",
                    "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/libxmtoau.c"
                    ,0x31,"int main(int, char **)");
    }
    xm_create_context_from_libxmize(&local_20,local_28,48000);
    puts_uint32_be((uint32_t)(sVar4 >> 0x20));
    puts_uint32_be((uint32_t)(sVar4 >> 0x20));
    puts_uint32_be((uint32_t)(sVar4 >> 0x20));
    puts_uint32_be((uint32_t)(sVar4 >> 0x20));
    puts_uint32_be((uint32_t)(sVar4 >> 0x20));
    puts_uint32_be((uint32_t)(sVar4 >> 0x20));
    puts_uint32_be((uint32_t)(sVar4 >> 0x20));
    while (uVar2 = xm_get_loop_count(local_20), uVar2 == '\0') {
      xm_generate_samples(in_stack_ffffffffffffbf20,in_stack_ffffffffffffbf18,sVar4);
      for (local_48 = 0; local_48 < 0x1000; local_48 = local_48 + 1) {
        local_4c = *(undefined4 *)(&stack0xffffffffffffbf18 + local_48 * 4);
        puts_uint32_be((uint32_t)(sVar4 >> 0x20));
      }
    }
    iVar3 = getrusage(RUSAGE_SELF,&local_e0);
    if (iVar3 != 0) {
      __assert_fail("!getrusage(RUSAGE_SELF, &r)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Artefact2[P]libxm/examples/libxmtoau.c"
                    ,0x4a,"int main(int, char **)");
    }
    fprintf(_stderr,"%s: libxmized length %lu, ru_maxrss %ld\n",*local_10,local_30,
            local_e0.ru_maxrss);
    munmap(local_28,local_30);
    fclose(local_38);
    puVar1 = local_18;
  }
  local_18 = puVar1;
  return *(int *)(local_18 + 0x40f4);
}

Assistant:

int main(int argc, char** argv) {
	float buffer[buffer_size];
	xm_context_t* ctx;
	void* data;
	size_t datalen;
	FILE* fp;

	if(argc != 2) return 1;

	fp = fopen(argv[1], "rb");
	assert(fp);
	assert(fread(&datalen, sizeof(size_t), 1, fp));
	rewind(fp);
	data = mmap(0, datalen, PROT_READ|PROT_WRITE, MAP_PRIVATE, fileno(fp), 0);
	assert(data != MAP_FAILED);
	xm_create_context_from_libxmize(&ctx, data, rate);

	puts_uint32_be(0x2E736E64); /* .snd magic number */
	puts_uint32_be(28); /* Header size */
	puts_uint32_be((uint32_t)(-1)); /* Data size, unknown */
	puts_uint32_be(6); /* Encoding: 32-bit IEEE floating point */
	puts_uint32_be(rate); /* Sample rate */
	puts_uint32_be(channels); /* Number of interleaved channels */
	puts_uint32_be(0); /* Optional text information */

	while(!xm_get_loop_count(ctx)) {
		xm_generate_samples(ctx, buffer, sizeof(buffer) / (channels * sizeof(float)));
		for(size_t k = 0; k < buffer_size; ++k) {
			union {
				float f;
				uint32_t i;
			} u;

			u.f = buffer[k];
			puts_uint32_be(u.i);
		}
	}

	struct rusage r;
	assert(!getrusage(RUSAGE_SELF, &r));
	fprintf(stderr, "%s: libxmized length %lu, ru_maxrss %ld\n", argv[0], datalen, r.ru_maxrss);

	munmap(data, datalen);
	fclose(fp);
	return 0;
}